

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.h
# Opt level: O2

void __thiscall
dg::vr::VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::LazyVisit>::DFSIt
          (DFSIt<dg::vr::VRCodeGraph::LazyVisit> *this,Function *f,VRLocation *start,Dir d)

{
  _Rb_tree_header *p_Var1;
  int local_24;
  void *local_20;
  VRLocation *local_18;
  
  p_Var1 = &(this->super_LazyVisit).visited._M_t._M_impl.super__Rb_tree_header;
  (this->super_LazyVisit).visited._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->super_LazyVisit).visited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_LazyVisit).visited._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_LazyVisit).visited._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_LazyVisit).visited._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->function = f;
  (this->stack).
  super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->stack).
  super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stack).
  super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->dir = d;
  local_24 = 0;
  local_20 = (void *)0x0;
  local_18 = start;
  std::
  vector<std::tuple<dg::vr::VRLocation*,unsigned_int,dg::vr::VREdge*>,std::allocator<std::tuple<dg::vr::VRLocation*,unsigned_int,dg::vr::VREdge*>>>
  ::emplace_back<dg::vr::VRLocation*,int,decltype(nullptr)>
            ((vector<std::tuple<dg::vr::VRLocation*,unsigned_int,dg::vr::VREdge*>,std::allocator<std::tuple<dg::vr::VRLocation*,unsigned_int,dg::vr::VREdge*>>>
              *)&this->stack,&local_18,&local_24,&local_20);
  visit(this,start);
  return;
}

Assistant:

DFSIt(const llvm::Function &f, const VRLocation *start, Dir d)
                : function(&f), dir(d) {
            stack.emplace_back(const_cast<VRLocation *>(start), 0, nullptr);
            visit(const_cast<VRLocation *>(start));
        }